

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O0

FName __thiscall UDMFParserBase::ParseKey(UDMFParserBase *this,bool checkblock,bool *isblock)

{
  int iVar1;
  bool bVar2;
  undefined1 *in_RCX;
  undefined7 in_register_00000031;
  FScanner *this_00;
  int savedtoken;
  bool neg;
  bool *isblock_local;
  bool checkblock_local;
  UDMFParserBase *this_local;
  FName *key;
  
  this_00 = (FScanner *)CONCAT71(in_register_00000031,checkblock);
  FScanner::MustGetString(this_00);
  FName::FName((FName *)this,this_00->String);
  if (((ulong)isblock & 1) != 0) {
    bVar2 = FScanner::CheckToken(this_00,0x7b);
    if (bVar2) {
      if (in_RCX != (undefined1 *)0x0) {
        *in_RCX = 1;
      }
      goto LAB_0060f920;
    }
    if (in_RCX != (undefined1 *)0x0) {
      *in_RCX = 0;
    }
  }
  FScanner::MustGetToken(this_00,0x3d);
  this_00->Number = 0;
  this_00->Float = 0.0;
  FScanner::MustGetAnyToken(this_00);
  if ((this_00->TokenType == 0x2b) || (this_00->TokenType == 0x2d)) {
    iVar1 = this_00->TokenType;
    FScanner::MustGetAnyToken(this_00);
    if ((this_00->TokenType != 0x104) && (this_00->TokenType != 0x106)) {
      FScanner::ScriptMessage(this_00,"Numeric constant expected");
    }
    if (iVar1 == 0x2d) {
      this_00->Number = -this_00->Number;
      this_00->Float = -this_00->Float;
    }
  }
  if (this_00->TokenType == 0x102) {
    FString::operator=((FString *)&this_00[1].StringLen,this_00->String);
  }
  iVar1 = this_00->TokenType;
  FScanner::MustGetToken(this_00,0x3b);
  this_00->TokenType = iVar1;
LAB_0060f920:
  return (FName)(int)this;
}

Assistant:

FName UDMFParserBase::ParseKey(bool checkblock, bool *isblock)
{
	sc.MustGetString();
	FName key = sc.String;
	if (checkblock)
	{
		if (sc.CheckToken('{'))
		{
			if (isblock) *isblock = true;
			return key;
		}
		else if (isblock) *isblock = false;
	}
	sc.MustGetToken('=');

	sc.Number = 0;
	sc.Float = 0;
	sc.MustGetAnyToken();

	if (sc.TokenType == '+' || sc.TokenType == '-')
	{
		bool neg = (sc.TokenType == '-');
		sc.MustGetAnyToken();
		if (sc.TokenType != TK_IntConst && sc.TokenType != TK_FloatConst)
		{
			sc.ScriptMessage("Numeric constant expected");
		}
		if (neg)
		{
			sc.Number = -sc.Number;
			sc.Float = -sc.Float;
		}
	}
	if (sc.TokenType == TK_StringConst)
	{
		parsedString = sc.String;
	}
	int savedtoken = sc.TokenType;
	sc.MustGetToken(';');
	sc.TokenType = savedtoken;
	return key;
}